

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

void flexbuffers::AppendToString<flexbuffers::FixedTypedVector>
               (string *s,FixedTypedVector *v,bool keys_quoted,bool indented,int cur_indent,
               char *indent_string,bool natural_utf8)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  Reference local_40;
  
  std::__cxx11::string::append((char *)s);
  std::__cxx11::string::append((char *)s);
  if (v->len_ != '\0') {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__cxx11::string::append((char *)s);
        std::__cxx11::string::append((char *)s);
      }
      iVar2 = cur_indent;
      if (0 < cur_indent && indented) {
        do {
          std::__cxx11::string::append((char *)s);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      if (uVar3 < v->len_) {
        uVar1 = (ulong)(v->super_Object).byte_width_;
        local_40.data_ = (v->super_Object).data_ + uVar3 * uVar1;
        local_40._8_8_ = uVar1 + ((ulong)*(uint *)&(v->super_Object).field_0xc << 0x20) + 0x100;
      }
      else {
        local_40._8_8_ = 0x101;
        local_40.data_ = (uint8_t *)0x0;
      }
      Reference::ToString(&local_40,true,keys_quoted,s,indented,cur_indent,indent_string,
                          natural_utf8);
      uVar3 = uVar3 + 1;
    } while (uVar3 < v->len_);
  }
  if (indented) {
    std::__cxx11::string::append((char *)s);
    if (1 < cur_indent) {
      iVar2 = cur_indent + -1;
      do {
        std::__cxx11::string::append((char *)s);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  else {
    std::__cxx11::string::append((char *)s);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void AppendToString(std::string &s, T &&v, bool keys_quoted, bool indented,
                    int cur_indent, const char *indent_string,
                    bool natural_utf8) {
  s += "[";
  s += indented ? "\n" : " ";
  for (size_t i = 0; i < v.size(); i++) {
    if (i) {
      s += ",";
      s += indented ? "\n" : " ";
    }
    if (indented) IndentString(s, cur_indent, indent_string);
    v[i].ToString(true, keys_quoted, s, indented, cur_indent,
                  indent_string, natural_utf8);
  }
  if (indented) {
    s += "\n";
    IndentString(s, cur_indent - 1, indent_string);
  } else {
    s += " ";
  }
  s += "]";
}